

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<double,2ul>
          (AsciiParser *this,char sep,
          vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *result)

{
  bool bVar1;
  allocator local_91;
  string local_90;
  undefined1 local_70 [8];
  array<double,_2UL> value_1;
  undefined1 local_58 [6];
  char c;
  undefined1 local_38 [8];
  array<double,_2UL> value;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *result_local;
  char sep_local;
  AsciiParser *this_local;
  
  value._M_elems[1] = (double)result;
  ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    bVar1 = ParseBasicTypeTuple<double,2ul>(this,(array<double,_2UL> *)local_38);
    if (bVar1) {
      ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::push_back
                ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                 value._M_elems[1],(value_type *)local_38);
      while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = Char1(this,(char *)((long)value_1._M_elems + 0xe));
        if (!bVar1) {
          return false;
        }
        if (value_1._M_elems[1]._6_1_ != sep) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = ParseBasicTypeTuple<double,2ul>(this,(array<double,_2UL> *)local_70);
        if (!bVar1) break;
        ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::push_back
                  ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   value._M_elems[1],(value_type *)local_70);
      }
      bVar1 = ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
              empty((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                    value._M_elems[1]);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_90,"Empty array.\n",&local_91);
        PushError(this,&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)local_58,"Not starting with the tuple value of requested type.\n",
                 (allocator *)((long)value_1._M_elems + 0xf));
      PushError(this,(string *)local_58);
      ::std::__cxx11::string::~string((string *)local_58);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)value_1._M_elems + 0xf));
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1TupleType(const char sep,
                                  std::vector<std::array<T, N>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      break;
    }

    result->push_back(value);
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}